

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O0

void __thiscall
PyreNet::NeuralNet::NeuralNet
          (NeuralNet *this,int inputSize,
          vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *layers)

{
  ActivationFactory *this_00;
  bool bVar1;
  size_type __n;
  reference pLVar2;
  Activation *local_78;
  Activation *activation;
  vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> tmp;
  LayerDefinition layer;
  const_iterator __end1;
  const_iterator __begin1;
  vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *__range1;
  int prevSize;
  ActivationFactory *local_28;
  ActivationFactory *activationFactory;
  vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *layers_local;
  NeuralNet *pNStack_10;
  int inputSize_local;
  NeuralNet *this_local;
  
  activationFactory = (ActivationFactory *)layers;
  layers_local._4_4_ = inputSize;
  pNStack_10 = this;
  std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::vector(&this->layers);
  local_28 = ActivationFactory::getInstance();
  this->inputSize = layers_local._4_4_;
  __n = std::vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>::size
                  ((vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *)
                   activationFactory);
  std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::reserve(&this->layers,__n);
  this_00 = activationFactory;
  __range1._0_4_ = layers_local._4_4_;
  __end1 = std::vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>::begin
                     ((vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *
                      )activationFactory);
  layer = (LayerDefinition)
          std::vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>::end
                    ((vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *)
                     this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_PyreNet::LayerDefinition_*,_std::vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>_>
                                *)&layer);
    if (!bVar1) break;
    pLVar2 = __gnu_cxx::
             __normal_iterator<const_PyreNet::LayerDefinition_*,_std::vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>_>
             ::operator*(&__end1);
    tmp.super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)pLVar2;
    std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::vector
              ((vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> *)&activation);
    std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::reserve
              ((vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> *)&activation,
               (long)tmp.
                     super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    local_78 = ActivationFactory::getActivation
                         (local_28,(activationType)
                                   tmp.
                                   super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<PyreNet::Layer,std::allocator<PyreNet::Layer>>::
    emplace_back<int&,int&,PyreNet::Activation*&>
              ((vector<PyreNet::Layer,std::allocator<PyreNet::Layer>> *)&this->layers,
               (int *)((long)&tmp.
                              super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
               (int *)&__range1,&local_78);
    __range1._0_4_ =
         tmp.super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
    std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::~vector
              ((vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> *)&activation);
    __gnu_cxx::
    __normal_iterator<const_PyreNet::LayerDefinition_*,_std::vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

NeuralNet::NeuralNet(int inputSize, const std::vector<LayerDefinition> &layers) {
        ActivationFactory* activationFactory = ActivationFactory::getInstance();
        this->inputSize = inputSize;
        this->layers.reserve(layers.size());
        int prevSize = inputSize;
        for (LayerDefinition layer : layers) {
            std::vector<Perceptron> tmp;
            tmp.reserve(layer.size);
            Activation* activation = activationFactory->getActivation(layer.activation);
            this->layers.emplace_back(layer.size, prevSize, activation);
            prevSize = layer.size;
        }
    }